

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O3

void __thiscall TasGrid::GridGlobal::loadGpuValues<double>(GridGlobal *this)

{
  double *pdVar1;
  CudaGlobalData<double> *in_RAX;
  pointer __p_00;
  CudaGlobalData<double> *this_00;
  pointer __p;
  _Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false> local_28;
  
  this_00 = (this->gpu_cache)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
            .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
  local_28._M_head_impl = in_RAX;
  if (this_00 == (CudaGlobalData<double> *)0x0) {
    __p_00 = (pointer)operator_new(0xe8);
    memset(__p_00,0,0xe8);
    local_28._M_head_impl = (CudaGlobalData<double> *)0x0;
    ::std::
    __uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
    ::reset((__uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             *)&this->gpu_cache,__p_00);
    ::std::
    unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                   *)&local_28);
    this_00 = (this->gpu_cache)._M_t.
              super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
              .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
  }
  if ((this_00->values).num_entries == 0) {
    pdVar1 = (this->super_BaseCanonicalGrid).values.values.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    GpuVector<double>::load
              (&this_00->values,(this->super_BaseCanonicalGrid).acceleration,
               (long)(this->super_BaseCanonicalGrid).values.values.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar1 >> 3,pdVar1);
  }
  return;
}

Assistant:

void GridGlobal::loadGpuValues() const{
    auto& ccache = getGpuCache<T>();
    if (!ccache) ccache = Utils::make_unique<CudaGlobalData<T>>();
    if (ccache->values.empty()) ccache->values.load(acceleration, values.begin(), values.end());
}